

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

ssize_t bgzf_read(BGZF *fp,void *data,size_t length)

{
  int iVar1;
  off_t oVar2;
  int local_50;
  uint8_t *buffer;
  int available;
  int copy_length;
  uint8_t *output;
  ssize_t bytes_read;
  size_t length_local;
  void *data_local;
  BGZF *fp_local;
  
  output = (uint8_t *)0x0;
  if (length == 0) {
    fp_local = (BGZF *)0x0;
  }
  else {
    _available = data;
    if ((*(int *)fp << 0xe) >> 0x1e != 0) {
      __assert_fail("fp->is_write == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x228,"ssize_t bgzf_read(BGZF *, void *, size_t)");
    }
    for (; output < length; output = output + local_50) {
      buffer._0_4_ = fp->block_length - fp->block_offset;
      if ((int)buffer < 1) {
        iVar1 = bgzf_read_block(fp);
        if (iVar1 != 0) {
          return -1;
        }
        buffer._0_4_ = fp->block_length - fp->block_offset;
        if ((int)buffer < 1) break;
      }
      if (length - (long)output < (ulong)(long)(int)buffer) {
        local_50 = (int)length - (int)output;
      }
      else {
        local_50 = (int)buffer;
      }
      memcpy(_available,(void *)((long)fp->uncompressed_block + (long)fp->block_offset),
             (long)local_50);
      fp->block_offset = local_50 + fp->block_offset;
      _available = (void *)((long)_available + (long)local_50);
    }
    if (fp->block_offset == fp->block_length) {
      oVar2 = htell(fp->fp);
      fp->block_address = oVar2;
      fp->block_length = 0;
      fp->block_offset = 0;
    }
    fp->uncompressed_address = (int64_t)(output + fp->uncompressed_address);
    fp_local = (BGZF *)output;
  }
  return (ssize_t)fp_local;
}

Assistant:

ssize_t bgzf_read(BGZF *fp, void *data, size_t length)
{
    ssize_t bytes_read = 0;
    uint8_t *output = (uint8_t*)data;
    if (length <= 0) return 0;
    assert(fp->is_write == 0);
    while (bytes_read < length) {
        int copy_length, available = fp->block_length - fp->block_offset;
        uint8_t *buffer;
        if (available <= 0) {
            if (bgzf_read_block(fp) != 0) return -1;
            available = fp->block_length - fp->block_offset;
            if (available <= 0) break;
        }
        copy_length = length - bytes_read < available? length - bytes_read : available;
        buffer = (uint8_t*)fp->uncompressed_block;
        memcpy(output, buffer + fp->block_offset, copy_length);
        fp->block_offset += copy_length;
        output += copy_length;
        bytes_read += copy_length;
    }
    if (fp->block_offset == fp->block_length) {
        fp->block_address = htell(fp->fp);
        fp->block_offset = fp->block_length = 0;
    }
    fp->uncompressed_address += bytes_read;
    return bytes_read;
}